

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
md::ROM::get_bytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                  ROM *this,uint32_t begin,uint32_t end)

{
  undefined8 in_RAX;
  ulong uVar1;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_38 = in_RAX;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,(ulong)(end - begin));
  if (begin < end) {
    uVar1 = (ulong)begin;
    do {
      uStack_38 = CONCAT17((this->_byte_array).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar1],(undefined7)uStack_38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,(uchar *)((long)&uStack_38 + 7));
      uVar1 = uVar1 + 1;
    } while (end != uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> ROM::get_bytes(uint32_t begin, uint32_t end) const
{
    std::vector<uint8_t> output;
    output.reserve(end - begin);

    for (uint32_t addr = begin; addr < end; addr += 0x1)
        output.emplace_back(this->get_byte(addr));

    return output;
}